

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_andnot.c
# Opt level: O0

_Bool bitset_run_container_iandnot
                (bitset_container_t *src_1,run_container_t *src_2,container_t **dst)

{
  uint uVar1;
  array_container_t *paVar2;
  bitset_container_t *in_RDX;
  int *in_RSI;
  int *in_RDI;
  rle16_t rle;
  int32_t rlepos;
  undefined2 in_stack_ffffffffffffffd8;
  ushort in_stack_ffffffffffffffda;
  int iVar3;
  
  *(int **)in_RDX = in_RDI;
  for (iVar3 = 0; iVar3 < *in_RSI; iVar3 = iVar3 + 1) {
    uVar1 = *(uint *)(*(long *)(in_RSI + 2) + (long)iVar3 * 4);
    in_stack_ffffffffffffffd8 = (undefined2)uVar1;
    in_stack_ffffffffffffffda = (ushort)(uVar1 >> 0x10);
    bitset_reset_range(*(uint64_t **)(in_RDI + 2),uVar1 & 0xffff,
                       (uVar1 & 0xffff) + (uint)in_stack_ffffffffffffffda + 1);
  }
  iVar3 = bitset_container_compute_cardinality
                    ((bitset_container_t *)
                     CONCAT44(iVar3,CONCAT22(in_stack_ffffffffffffffda,in_stack_ffffffffffffffd8)));
  *in_RDI = iVar3;
  iVar3 = *in_RDI;
  if (0x1000 >= iVar3) {
    paVar2 = array_container_from_bitset(in_RDX);
    *(array_container_t **)in_RDX = paVar2;
    bitset_container_free((bitset_container_t *)0x167f75);
  }
  return 0x1000 < iVar3;
}

Assistant:

bool bitset_run_container_iandnot(bitset_container_t *src_1,
                                  const run_container_t *src_2,
                                  container_t **dst) {
    *dst = src_1;

    for (int32_t rlepos = 0; rlepos < src_2->n_runs; ++rlepos) {
        rle16_t rle = src_2->runs[rlepos];
        bitset_reset_range(src_1->words, rle.value,
                           rle.value + rle.length + UINT32_C(1));
    }
    src_1->cardinality = bitset_container_compute_cardinality(src_1);

    if (src_1->cardinality <= DEFAULT_MAX_SIZE) {
        *dst = array_container_from_bitset(src_1);
        bitset_container_free(src_1);
        return false;  // not bitset
    } else
        return true;
}